

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void __thiscall
Search::search::set_label_parser(search *this,label_parser *lp,_func_bool_polylabel_ptr *is_test)

{
  long lVar1;
  label_parser *plVar2;
  byte bVar3;
  
  bVar3 = 0;
  if ((this->priv->all->vw_is_main == true) && (this->priv->state != INITIALIZE)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning: task should not set label parser except in initialize function!",0x48);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  plVar2 = &this->priv->all->p->lp;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    plVar2->default_label = lp->default_label;
    lp = (label_parser *)((long)lp + (ulong)bVar3 * -0x10 + 8);
    plVar2 = (label_parser *)((long)plVar2 + ((ulong)bVar3 * -2 + 1) * 8);
  }
  (this->priv->all->p->lp).test_label = (_func_bool_void_ptr *)is_test;
  this->priv->label_is_test = is_test;
  return;
}

Assistant:

void search::set_label_parser(label_parser& lp, bool (*is_test)(polylabel&))
{
  if (this->priv->all->vw_is_main && (this->priv->state != INITIALIZE))
    std::cerr << "warning: task should not set label parser except in initialize function!" << endl;
  this->priv->all->p->lp = lp;
  this->priv->all->p->lp.test_label = (bool (*)(void*))is_test;
  this->priv->label_is_test = is_test;
}